

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * __thiscall
libtorrent::combine_path_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,string_view lhs,string_view rhs)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  string_view *__t;
  char *pcVar5;
  char *pcVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  allocator<char> local_51;
  string_view rhs_local;
  string_view lhs_local;
  
  pcVar5 = (char *)rhs._M_len;
  pcVar3 = lhs._M_str;
  pcVar4 = (char *)lhs._M_len;
  rhs_local._M_len = (size_t)pcVar3;
  rhs_local._M_str = pcVar5;
  lhs_local._M_len = (size_t)this;
  lhs_local._M_str = pcVar4;
  if ((this == (libtorrent *)0x0) ||
     (__y._M_str = ".", __y._M_len = 1, __x._M_str = pcVar4, __x._M_len = (size_t)this,
     bVar2 = ::std::operator==(__x,__y), bVar2)) {
    __t = &rhs_local;
  }
  else {
    if ((pcVar3 != (char *)0x0) &&
       (__y_00._M_str = ".", __y_00._M_len = 1, __x_00._M_str = pcVar5,
       __x_00._M_len = (size_t)pcVar3, bVar2 = ::std::operator==(__x_00,__y_00), !bVar2)) {
      cVar1 = (pcVar4 + -1)[(long)this];
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      pcVar6 = "/";
      if (cVar1 == '/') {
        pcVar6 = "";
      }
      snprintf((__return_storage_ptr__->_M_dataplus)._M_p,(size_t)(pcVar3 + (long)this + 2),
               "%*s%s%*s",(ulong)this & 0xffffffff,pcVar4,pcVar6,pcVar3,pcVar5);
      ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    __t = &lhs_local;
  }
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__t,&local_51);
  return __return_storage_ptr__;
}

Assistant:

std::string combine_path(string_view lhs, string_view rhs)
	{
		TORRENT_ASSERT(!is_complete(rhs));
		if (lhs.empty() || lhs == ".") return std::string(rhs);
		if (rhs.empty() || rhs == ".") return std::string(lhs);

#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
#define TORRENT_SEPARATOR "\\"
		bool const need_sep = lhs[lhs.size() - 1] != '\\' && lhs[lhs.size() - 1] != '/';
#else
#define TORRENT_SEPARATOR "/"
		bool const need_sep = lhs[lhs.size() - 1] != '/';
#endif
		std::string ret;
		std::size_t target_size = lhs.size() + rhs.size() + 2;
		ret.resize(target_size);
		target_size = aux::numeric_cast<std::size_t>(std::snprintf(&ret[0], target_size, "%*s%s%*s"
			, int(lhs.size()), lhs.data()
			, (need_sep ? TORRENT_SEPARATOR : "")
			, int(rhs.size()), rhs.data()));
		ret.resize(target_size);
		return ret;
	}